

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

ExtkeyVersionPair __thiscall
cfd::core::KeyFormatData::GetVersionPair(KeyFormatData *this,Bip32FormatType format_type)

{
  undefined8 uVar1;
  undefined4 in_stack_ffffffffffffffa0;
  CfdError in_stack_ffffffffffffffac;
  CfdException *in_stack_ffffffffffffffb0;
  allocator local_41;
  string local_40 [36];
  Bip32FormatType local_1c;
  KeyFormatData *pKStack_18;
  Bip32FormatType format_type_local;
  KeyFormatData *this_local;
  
  if (format_type == kNormal) {
    this_local = *(KeyFormatData **)&this->bip32_;
  }
  else if (format_type == kBip49) {
    this_local = *(KeyFormatData **)&this->bip49_;
  }
  else {
    if (format_type != kBip84) {
      local_1c = format_type;
      pKStack_18 = this;
      uVar1 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_40,"unknown format type.",&local_41);
      CfdException::CfdException
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                 (string *)CONCAT44(format_type,in_stack_ffffffffffffffa0));
      __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
    }
    this_local = *(KeyFormatData **)&this->bip84_;
  }
  return (ExtkeyVersionPair)this_local;
}

Assistant:

ExtkeyVersionPair KeyFormatData::GetVersionPair(
    Bip32FormatType format_type) const {
  switch (format_type) {
    case kNormal:
      return bip32_;
    case kBip49:
      return bip49_;
    case kBip84:
      return bip84_;
    default:
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "unknown format type.");
  }
}